

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

void __thiscall ON_SHA1_Hash::Dump(ON_SHA1_Hash *this,ON_TextLog *text_log)

{
  undefined4 uVar1;
  wchar_t *pwVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ON_wString sha1_hash;
  ON_wString local_20;
  ON_wString local_18;
  
  ON_wString::ON_wString(&local_20);
  auVar3[0] = -(this->m_digest[0] == ZeroDigest.m_digest[0]);
  auVar3[1] = -(this->m_digest[1] == ZeroDigest.m_digest[1]);
  auVar3[2] = -(this->m_digest[2] == ZeroDigest.m_digest[2]);
  auVar3[3] = -(this->m_digest[3] == ZeroDigest.m_digest[3]);
  auVar3[4] = -(this->m_digest[4] == ZeroDigest.m_digest[4]);
  auVar3[5] = -(this->m_digest[5] == ZeroDigest.m_digest[5]);
  auVar3[6] = -(this->m_digest[6] == ZeroDigest.m_digest[6]);
  auVar3[7] = -(this->m_digest[7] == ZeroDigest.m_digest[7]);
  auVar3[8] = -(this->m_digest[8] == ZeroDigest.m_digest[8]);
  auVar3[9] = -(this->m_digest[9] == ZeroDigest.m_digest[9]);
  auVar3[10] = -(this->m_digest[10] == ZeroDigest.m_digest[10]);
  auVar3[0xb] = -(this->m_digest[0xb] == ZeroDigest.m_digest[0xb]);
  auVar3[0xc] = -(this->m_digest[0xc] == ZeroDigest.m_digest[0xc]);
  auVar3[0xd] = -(this->m_digest[0xd] == ZeroDigest.m_digest[0xd]);
  auVar3[0xe] = -(this->m_digest[0xe] == ZeroDigest.m_digest[0xe]);
  auVar3[0xf] = -(this->m_digest[0xf] == ZeroDigest.m_digest[0xf]);
  uVar1 = *(undefined4 *)(this->m_digest + 0x10);
  auVar5[0] = -((ON__UINT8)uVar1 == ZeroDigest.m_digest[0x10]);
  auVar5[1] = -((ON__UINT8)((uint)uVar1 >> 8) == ZeroDigest.m_digest[0x11]);
  auVar5[2] = -((ON__UINT8)((uint)uVar1 >> 0x10) == ZeroDigest.m_digest[0x12]);
  auVar5[3] = -((ON__UINT8)((uint)uVar1 >> 0x18) == ZeroDigest.m_digest[0x13]);
  auVar5[4] = 0xff;
  auVar5[5] = 0xff;
  auVar5[6] = 0xff;
  auVar5[7] = 0xff;
  auVar5[8] = 0xff;
  auVar5[9] = 0xff;
  auVar5[10] = 0xff;
  auVar5[0xb] = 0xff;
  auVar5[0xc] = 0xff;
  auVar5[0xd] = 0xff;
  auVar5[0xe] = 0xff;
  auVar5[0xf] = 0xff;
  auVar5 = auVar5 & auVar3;
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
    pwVar2 = L"ZeroDigest";
  }
  else {
    auVar4[0] = -(this->m_digest[0] == EmptyContentHash.m_digest[0]);
    auVar4[1] = -(this->m_digest[1] == EmptyContentHash.m_digest[1]);
    auVar4[2] = -(this->m_digest[2] == EmptyContentHash.m_digest[2]);
    auVar4[3] = -(this->m_digest[3] == EmptyContentHash.m_digest[3]);
    auVar4[4] = -(this->m_digest[4] == EmptyContentHash.m_digest[4]);
    auVar4[5] = -(this->m_digest[5] == EmptyContentHash.m_digest[5]);
    auVar4[6] = -(this->m_digest[6] == EmptyContentHash.m_digest[6]);
    auVar4[7] = -(this->m_digest[7] == EmptyContentHash.m_digest[7]);
    auVar4[8] = -(this->m_digest[8] == EmptyContentHash.m_digest[8]);
    auVar4[9] = -(this->m_digest[9] == EmptyContentHash.m_digest[9]);
    auVar4[10] = -(this->m_digest[10] == EmptyContentHash.m_digest[10]);
    auVar4[0xb] = -(this->m_digest[0xb] == EmptyContentHash.m_digest[0xb]);
    auVar4[0xc] = -(this->m_digest[0xc] == EmptyContentHash.m_digest[0xc]);
    auVar4[0xd] = -(this->m_digest[0xd] == EmptyContentHash.m_digest[0xd]);
    auVar4[0xe] = -(this->m_digest[0xe] == EmptyContentHash.m_digest[0xe]);
    auVar4[0xf] = -(this->m_digest[0xf] == EmptyContentHash.m_digest[0xf]);
    uVar1 = *(undefined4 *)(this->m_digest + 0x10);
    auVar6[0] = -((ON__UINT8)uVar1 == EmptyContentHash.m_digest[0x10]);
    auVar6[1] = -((ON__UINT8)((uint)uVar1 >> 8) == EmptyContentHash.m_digest[0x11]);
    auVar6[2] = -((ON__UINT8)((uint)uVar1 >> 0x10) == EmptyContentHash.m_digest[0x12]);
    auVar6[3] = -((ON__UINT8)((uint)uVar1 >> 0x18) == EmptyContentHash.m_digest[0x13]);
    auVar6[4] = 0xff;
    auVar6[5] = 0xff;
    auVar6[6] = 0xff;
    auVar6[7] = 0xff;
    auVar6[8] = 0xff;
    auVar6[9] = 0xff;
    auVar6[10] = 0xff;
    auVar6[0xb] = 0xff;
    auVar6[0xc] = 0xff;
    auVar6[0xd] = 0xff;
    auVar6[0xe] = 0xff;
    auVar6[0xf] = 0xff;
    auVar6 = auVar6 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      ON_wString::HexadecimalFromBytes(&local_18,this->m_digest,0x14,true,false);
      ON_wString::operator=(&local_20,&local_18);
      ON_wString::~ON_wString(&local_18);
      goto LAB_005b7dc0;
    }
    pwVar2 = L"EmptyContentHash";
  }
  ON_wString::operator=(&local_20,pwVar2);
LAB_005b7dc0:
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_20);
  ON_TextLog::Print(text_log,L"ON_SHA1_Hash::%ls",pwVar2);
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_SHA1_Hash::Dump(
class ON_TextLog& text_log
  ) const
{
  ON_wString sha1_hash;
  if ( ON_SHA1_Hash::ZeroDigest == *this )
    sha1_hash = L"ZeroDigest";
  else if ( ON_SHA1_Hash::EmptyContentHash == *this )
    sha1_hash = L"EmptyContentHash";
  else 
    sha1_hash = ToString(true);
  text_log.Print(L"ON_SHA1_Hash::%ls",static_cast<const wchar_t*>(sha1_hash));
}